

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtk_writer.cc
# Opt level: O3

void __thiscall
lf::io::VtkWriter::WriteScalarPointData<char>
          (VtkWriter *this,string *name,MeshDataSet<char> *mds,char undefined_value)

{
  Attributes *data_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  element_type *peVar3;
  undefined8 uVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  undefined4 extraout_var;
  char *pcVar8;
  long extraout_RDX;
  long lVar9;
  ScalarData<char> data;
  stringstream ss;
  ScalarData<char> local_268;
  vector<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>,std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>>>
  *local_208;
  VtkWriter *local_200;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [24];
  undefined1 local_1a0 [56];
  char local_168 [312];
  
  if (this->order_ == '\x01') {
    data_00 = &(this->vtk_file_).point_data;
    CheckAttributeSetName<std::vector<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>,std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>>>>
              (this,data_00,name);
    local_268.lookup_table._M_string_length = 0;
    local_268.lookup_table.field_2._M_allocated_capacity = 0;
    local_268.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_268.lookup_table._M_dataplus._M_p = (char *)0x0;
    local_268.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_268.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_268.name.field_2._M_allocated_capacity = 0;
    local_268.name.field_2._8_8_ = 0;
    local_268.name._M_dataplus._M_p = (pointer)0x0;
    local_268.name._M_string_length = 0;
    local_268.lookup_table.field_2._8_8_ = 0;
    VtkFile::ScalarData<char>::ScalarData(&local_268);
    peVar3 = (this->mesh_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    uVar6 = (**peVar3->_vptr_Mesh)(peVar3);
    uVar6 = (*peVar3->_vptr_Mesh[3])(peVar3,(ulong)uVar6);
    std::vector<char,_std::allocator<char>_>::resize(&local_268.data,(ulong)uVar6);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&local_268.name,name);
    peVar3 = (this->mesh_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_208 = (vector<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>,std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>>>
                 *)data_00;
    local_200 = this;
    uVar6 = (**peVar3->_vptr_Mesh)(peVar3);
    iVar7 = (*peVar3->_vptr_Mesh[2])(peVar3,(ulong)uVar6);
    if (extraout_RDX != 0) {
      lVar9 = 0;
      do {
        uVar4 = *(undefined8 *)(CONCAT44(extraout_var,iVar7) + lVar9);
        cVar5 = (**(code **)(*(long *)mds + 8))(mds,uVar4);
        if (cVar5 == '\0') {
          peVar3 = (local_200->mesh_).
                   super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          uVar6 = (*peVar3->_vptr_Mesh[5])(peVar3,uVar4);
          cVar5 = undefined_value;
        }
        else {
          pcVar8 = (char *)(*(code *)**(undefined8 **)mds)(mds,uVar4);
          cVar5 = *pcVar8;
          peVar3 = (local_200->mesh_).
                   super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          uVar6 = (*peVar3->_vptr_Mesh[5])(peVar3,uVar4);
        }
        local_268.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar6] = cVar5;
        lVar9 = lVar9 + 8;
      } while (extraout_RDX << 3 != lVar9);
    }
    local_1b8._8_8_ = local_1a0;
    paVar1 = &local_268.name.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268.name._M_dataplus._M_p == paVar1) {
      local_1a0._8_8_ = local_268.name.field_2._8_8_;
    }
    else {
      local_1b8._8_8_ = local_268.name._M_dataplus._M_p;
    }
    local_1a0._0_8_ = local_268.name.field_2._M_allocated_capacity;
    paVar2 = &local_268.lookup_table.field_2;
    local_1a0._40_8_ = local_168;
    local_1b8._16_8_ = local_268.name._M_string_length;
    local_268.name._M_string_length = 0;
    local_268.name.field_2._M_allocated_capacity =
         local_268.name.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_1a0._16_8_ =
         local_268.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_1a0._24_8_ =
         local_268.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_1a0._32_8_ =
         local_268.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_268.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_268.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_268.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268.lookup_table._M_dataplus._M_p == paVar2) {
      local_168[8] = local_268.lookup_table.field_2._M_local_buf[8];
      local_168[9] = local_268.lookup_table.field_2._M_local_buf[9];
      local_168[10] = local_268.lookup_table.field_2._M_local_buf[10];
      local_168[0xb] = local_268.lookup_table.field_2._M_local_buf[0xb];
      local_168[0xc] = local_268.lookup_table.field_2._M_local_buf[0xc];
      local_168[0xd] = local_268.lookup_table.field_2._M_local_buf[0xd];
      local_168[0xe] = local_268.lookup_table.field_2._M_local_buf[0xe];
      local_168[0xf] = local_268.lookup_table.field_2._M_local_buf[0xf];
    }
    else {
      local_1a0._40_8_ = local_268.lookup_table._M_dataplus._M_p;
    }
    local_168[0] = local_268.lookup_table.field_2._M_local_buf[0];
    local_168[1] = local_268.lookup_table.field_2._M_local_buf[1];
    local_168[2] = local_268.lookup_table.field_2._M_local_buf[2];
    local_168[3] = local_268.lookup_table.field_2._M_local_buf[3];
    local_168[4] = local_268.lookup_table.field_2._M_local_buf[4];
    local_168[5] = local_268.lookup_table.field_2._M_local_buf[5];
    local_168[6] = local_268.lookup_table.field_2._M_local_buf[6];
    local_168[7] = local_268.lookup_table.field_2._M_local_buf[7];
    local_1a0._48_8_ = local_268.lookup_table._M_string_length;
    local_268.lookup_table._M_string_length = 0;
    local_268.lookup_table.field_2._M_allocated_capacity =
         local_268.lookup_table.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_1b8._0_4_ = 0;
    local_268.name._M_dataplus._M_p = (pointer)paVar1;
    local_268.lookup_table._M_dataplus._M_p = (pointer)paVar2;
    std::
    vector<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>,std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>>>
    ::
    emplace_back<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>>
              (local_208,
               (variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>
                *)local_1b8);
    boost::
    variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>
    ::destroy_content((variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>
                       *)local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268.lookup_table._M_dataplus._M_p != paVar2) {
      operator_delete(local_268.lookup_table._M_dataplus._M_p,
                      local_268.lookup_table.field_2._M_allocated_capacity + 1);
    }
    if (local_268.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_268.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_268.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_268.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268.name._M_dataplus._M_p != paVar1) {
      operator_delete(local_268.name._M_dataplus._M_p,
                      local_268.name.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b8 + 0x10),
             "WritePointData accepts MeshDataSets only if order = 1. For order > 1 you have to provide MeshFunctions."
             ,0x67);
  paVar1 = &local_268.name.field_2;
  local_268.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"order_ == 1","");
  paVar2 = &local_1f8.field_2;
  local_1f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f8,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/vtk_writer.cc"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed(&local_268.name,&local_1f8,0x3c1,&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_268.name._M_dataplus._M_p,local_268.name.field_2._M_allocated_capacity + 1
                   );
  }
  local_268.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"false","");
  local_1f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f8,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/vtk_writer.cc"
             ,"");
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"");
  base::AssertionFailed(&local_268.name,&local_1f8,0x3c1,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_268);
  abort();
}

Assistant:

void VtkWriter::WriteScalarPointData(const std::string& name,
                                     const mesh::utils::MeshDataSet<T>& mds,
                                     T undefined_value) {
  LF_ASSERT_MSG(order_ == 1,
                "WritePointData accepts MeshDataSets only if order = 1. For "
                "order > 1 you have to provide MeshFunctions.");
  CheckAttributeSetName(vtk_file_.point_data, name);
  VtkFile::ScalarData<T> data{};
  data.data.resize(mesh_->NumEntities(mesh_->DimMesh()));
  data.name = name;
  for (const auto* p : mesh_->Entities(mesh_->DimMesh())) {
    if (mds.DefinedOn(*p)) {
      data.data[mesh_->Index(*p)] = mds(*p);
    } else {
      data.data[mesh_->Index(*p)] = undefined_value;
    }
  }
  vtk_file_.point_data.push_back(std::move(data));
}